

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbAbc.c
# Opt level: O1

Acb_Ntk_t * Acb_NtkFromAbc2(Abc_Ntk_t *p)

{
  uint uVar1;
  int iVar2;
  void *pvVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  long *plVar6;
  long lVar7;
  Abc_Nam_t *p_00;
  int iVar8;
  undefined8 in_RAX;
  Acb_Man_t *p_01;
  Acb_Ntk_t *p_02;
  word *pwVar9;
  Vec_Ptr_t *pVVar10;
  word wVar11;
  char *pcVar12;
  Abc_Nam_t *in_RCX;
  ulong uVar13;
  Abc_Nam_t *in_RDX;
  Abc_Nam_t *in_R8;
  Hash_IntMan_t *in_R9;
  long lVar14;
  int *piVar15;
  long lVar16;
  long lVar17;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  p_01 = Acb_ManAlloc(p->pSpec,0,in_RDX,in_RCX,in_R8,in_R9);
  iVar8 = Abc_NamStrFindOrAdd(p_01->pStrs,p->pName,(int *)0x0);
  uVar1 = p->vCos->nSize;
  uVar13 = (ulong)uVar1;
  p_02 = Acb_NtkAlloc(p_01,iVar8,p->vCis->nSize,uVar1,p->nObjs);
  if ((p->ntkFunc != ABC_FUNC_SOP) || (p->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbAbc.c"
                  ,0x35,"Acb_Ntk_t *Acb_NtkFromAbc2(Abc_Ntk_t *)");
  }
  p_02->nFaninMax = 6;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar16];
      iVar8 = Acb_ObjAlloc(p_02,ABC_OPER_CI,0,(int)uVar13);
      *(int *)((long)pvVar3 + 0x40) = iVar8;
      lVar16 = lVar16 + 1;
      pVVar10 = p->vCis;
      uVar13 = (ulong)pVVar10->nSize;
    } while (lVar16 < (long)uVar13);
  }
  pVVar10 = p->vObjs;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar16];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) {
        iVar8 = Acb_ObjAlloc(p_02,ABC_OPER_LUT,*(int *)((long)pvVar3 + 0x1c),(int)uVar13);
        *(int *)((long)pvVar3 + 0x40) = iVar8;
      }
      lVar16 = lVar16 + 1;
      pVVar10 = p->vObjs;
      uVar13 = (ulong)pVVar10->nSize;
    } while (lVar16 < (long)uVar13);
  }
  pVVar10 = p->vCos;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar16];
      iVar8 = Acb_ObjAlloc(p_02,ABC_OPER_CO,1,(int)uVar13);
      *(int *)((long)pvVar3 + 0x40) = iVar8;
      lVar16 = lVar16 + 1;
      pVVar10 = p->vCos;
      uVar13 = (ulong)pVVar10->nSize;
    } while (lVar16 < (long)uVar13);
  }
  pVVar4 = p->vObjs;
  if (0 < pVVar4->nSize) {
    ppvVar5 = pVVar4->pArray;
    lVar16 = 0;
    do {
      plVar6 = (long *)ppvVar5[lVar16];
      if (((plVar6 != (long *)0x0) && ((*(uint *)((long)plVar6 + 0x14) & 0xf) == 7)) &&
         (0 < *(int *)((long)plVar6 + 0x1c))) {
        lVar17 = plVar6[4];
        lVar7 = *(long *)(*(long *)(*plVar6 + 0x20) + 8);
        lVar14 = 0;
        do {
          iVar8 = (int)plVar6[8];
          if ((long)iVar8 < 1) goto LAB_0038ca0f;
          if ((p_02->vObjFans).nSize <= iVar8) goto LAB_0038c9f0;
          iVar8 = (p_02->vObjFans).pArray[iVar8];
          if (((long)iVar8 < 0) || ((p_02->vFanSto).nSize <= iVar8)) goto LAB_0038c993;
          iVar2 = *(int *)(*(long *)(lVar7 + (long)*(int *)(lVar17 + lVar14 * 4) * 8) + 0x40);
          if (iVar2 < 1) goto LAB_0038c9d1;
          piVar15 = (p_02->vFanSto).pArray + iVar8;
          iVar8 = *piVar15;
          if (piVar15[(long)iVar8 + 1] != -1) goto LAB_0038c9b2;
          *piVar15 = iVar8 + 1;
          piVar15[(long)iVar8 + 1] = iVar2;
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)((long)plVar6 + 0x1c));
      }
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar4->nSize);
  }
  if (0 < pVVar10->nSize) {
    ppvVar5 = pVVar10->pArray;
    lVar16 = 0;
    do {
      plVar6 = (long *)ppvVar5[lVar16];
      iVar8 = (int)plVar6[8];
      if ((long)iVar8 < 1) {
LAB_0038ca0f:
        __assert_fail("i>0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0xfe,"int Acb_ObjFanOffset(Acb_Ntk_t *, int)");
      }
      if ((p_02->vObjFans).nSize <= iVar8) {
LAB_0038c9f0:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = (p_02->vObjFans).pArray[iVar8];
      if (((long)iVar8 < 0) || ((p_02->vFanSto).nSize <= iVar8)) {
LAB_0038c993:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
      }
      iVar2 = *(int *)(*(long *)(*(long *)(*(long *)(*plVar6 + 0x20) + 8) +
                                (long)*(int *)plVar6[4] * 8) + 0x40);
      if (iVar2 < 1) {
LAB_0038c9d1:
        __assert_fail("iFanin > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x1a3,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
      }
      piVar15 = (p_02->vFanSto).pArray + iVar8;
      iVar8 = *piVar15;
      if (piVar15[(long)iVar8 + 1] != -1) {
LAB_0038c9b2:
        __assert_fail("pFanins[ 1 + pFanins[0] ] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                      ,0x1a4,"void Acb_ObjAddFanin(Acb_Ntk_t *, int, int)");
      }
      *piVar15 = iVar8 + 1;
      piVar15[(long)iVar8 + 1] = iVar2;
      lVar16 = lVar16 + 1;
    } while (lVar16 < pVVar10->nSize);
  }
  uVar1 = (p_02->vObjType).nCap;
  if ((p_02->vObjTruth).nCap < (int)uVar1) {
    pwVar9 = (p_02->vObjTruth).pArray;
    if (pwVar9 == (word *)0x0) {
      pwVar9 = (word *)malloc((long)(int)uVar1 << 3);
    }
    else {
      pwVar9 = (word *)realloc(pwVar9,(long)(int)uVar1 << 3);
    }
    (p_02->vObjTruth).pArray = pwVar9;
    if (pwVar9 == (word *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                    ,0x205,"void Vec_WrdGrow(Vec_Wrd_t *, int)");
    }
    (p_02->vObjTruth).nCap = uVar1;
  }
  if (0 < (int)uVar1) {
    memset((p_02->vObjTruth).pArray,0,(ulong)uVar1 * 8);
  }
  (p_02->vObjTruth).nSize = uVar1;
  pVVar10 = p->vObjs;
  if (0 < pVVar10->nSize) {
    lVar16 = 0;
    do {
      pvVar3 = pVVar10->pArray[lVar16];
      if ((pvVar3 != (void *)0x0) && ((*(uint *)((long)pvVar3 + 0x14) & 0xf) == 7)) {
        iVar8 = *(int *)((long)pvVar3 + 0x40);
        lVar17 = (long)iVar8;
        wVar11 = Abc_SopToTruth(*(char **)((long)pvVar3 + 0x38),*(int *)((long)pvVar3 + 0x1c));
        if (lVar17 < 1) {
          pcVar12 = "i>0";
LAB_0038ca5d:
          __assert_fail(pcVar12,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
        }
        iVar2 = (p_02->vObjTruth).nSize;
        if (iVar2 < 1) {
          pcVar12 = "Acb_NtkHasObjTruths(p)";
          goto LAB_0038ca5d;
        }
        if (iVar2 <= iVar8) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                        ,0x1ad,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
        }
        pwVar9 = (p_02->vObjTruth).pArray;
        if (pwVar9[lVar17] != 0) {
          __assert_fail("Acb_ObjTruth(p, i) == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                        ,0x11d,"void Acb_ObjSetTruth(Acb_Ntk_t *, int, word)");
        }
        pwVar9[lVar17] = wVar11;
      }
      lVar16 = lVar16 + 1;
      pVVar10 = p->vObjs;
    } while (lVar16 < pVVar10->nSize);
  }
  p_02->nRegs = p->nObjCounts[8];
  p_00 = p_01->pMods;
  pcVar12 = Abc_NamStr(p_02->pDesign->pStrs,p_02->NameId);
  iVar8 = Abc_NamStrFindOrAdd(p_00,pcVar12,(int *)((long)&uStack_38 + 4));
  if (uStack_38._4_4_ == 0) {
    if (iVar8 != p_02->Id) {
      __assert_fail("NtkId == pNtk->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acb.h"
                    ,0x2a0,"void Acb_NtkAdd(Acb_Man_t *, Acb_Ntk_t *)");
    }
  }
  else {
    pcVar12 = Abc_NamStr(p_02->pDesign->pStrs,p_02->NameId);
    printf("Network with name \"%s\" already exists.\n",pcVar12);
  }
  return p_02;
}

Assistant:

ABC_NAMESPACE_IMPL_START

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Acb_Ntk_t * Acb_NtkFromAbc2( Abc_Ntk_t * p )
{
    Acb_Man_t * pMan = Acb_ManAlloc( Abc_NtkSpec(p), 1, NULL, NULL, NULL, NULL );
    int i, k, NameId = Abc_NamStrFindOrAdd( pMan->pStrs, Abc_NtkName(p), NULL );
    Acb_Ntk_t * pNtk = Acb_NtkAlloc( pMan, NameId, Abc_NtkCiNum(p), Abc_NtkCoNum(p), Abc_NtkObjNum(p) );
    Abc_Obj_t * pObj, * pFanin;
    assert( Abc_NtkIsSopLogic(p) );
    pNtk->nFaninMax = 6;
    Abc_NtkForEachCi( p, pObj, i )
        pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CI, 0, 0 );
    Abc_NtkForEachNode( p, pObj, i )
        pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_LUT, Abc_ObjFaninNum(pObj), 0 );
    Abc_NtkForEachCo( p, pObj, i )
        pObj->iTemp = Acb_ObjAlloc( pNtk, ABC_OPER_CO, 1, 0 );
    Abc_NtkForEachNode( p, pObj, i )
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Acb_ObjAddFanin( pNtk, pObj->iTemp, pFanin->iTemp );
    Abc_NtkForEachCo( p, pObj, i )
        Acb_ObjAddFanin( pNtk, pObj->iTemp, Abc_ObjFanin(pObj, 0)->iTemp );
    Acb_NtkCleanObjTruths( pNtk );
    Abc_NtkForEachNode( p, pObj, i )
        Acb_ObjSetTruth( pNtk, pObj->iTemp, Abc_SopToTruth((char *)pObj->pData, Abc_ObjFaninNum(pObj)) );
    Acb_NtkSetRegNum( pNtk, Abc_NtkLatchNum(p) );
    Acb_NtkAdd( pMan, pNtk );
    return pNtk;
}